

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameColumnElistNames(Parse *pParse,RenameCtx *pCtx,ExprList *pEList,char *zOld)

{
  char *zLeft;
  int iVar1;
  char *zName;
  int i;
  char *zOld_local;
  ExprList *pEList_local;
  RenameCtx *pCtx_local;
  Parse *pParse_local;
  
  if (pEList != (ExprList *)0x0) {
    for (zName._4_4_ = 0; zName._4_4_ < pEList->nExpr; zName._4_4_ = zName._4_4_ + 1) {
      zLeft = pEList->a[zName._4_4_].zName;
      iVar1 = sqlite3_stricmp(zLeft,zOld);
      if (iVar1 == 0) {
        renameTokenFind(pParse,pCtx,zLeft);
      }
    }
  }
  return;
}

Assistant:

static void renameColumnElistNames(
  Parse *pParse, 
  RenameCtx *pCtx, 
  ExprList *pEList, 
  const char *zOld
){
  if( pEList ){
    int i;
    for(i=0; i<pEList->nExpr; i++){
      char *zName = pEList->a[i].zName;
      if( 0==sqlite3_stricmp(zName, zOld) ){
        renameTokenFind(pParse, pCtx, (void*)zName);
      }
    }
  }
}